

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O3

void pzshape::TPZShapePiram::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pdVar3 = pt->fStore;
  dVar8 = *pdVar3;
  dVar7 = pdVar3[1];
  if ((((1e-10 <= ABS(dVar8)) || (1e-10 <= ABS(dVar7))) || (pdVar3[2] != 1.0)) || (NAN(pdVar3[2])))
  {
    dVar4 = 1.0 - pdVar3[2];
    dVar5 = ((dVar4 - dVar8) * 0.5) / dVar4;
    dVar9 = ((dVar4 - dVar7) * 0.5) / dVar4;
    dVar8 = ((dVar8 + dVar4) * 0.5) / dVar4;
    lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar7 = ((dVar7 + dVar4) * 0.5) / dVar4;
    pdVar3 = phi->fElem;
    *pdVar3 = dVar5 * dVar9 * dVar4;
    if ((lVar2 < 2) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[1] = dVar9 * dVar8 * dVar4;
    if ((lVar2 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[2] = dVar8 * dVar7 * dVar4;
    if ((lVar2 < 4) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[3] = dVar5 * dVar7 * dVar4;
    pdVar1 = pt->fStore;
    if ((lVar2 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[4] = pdVar1[2];
    dVar8 = *pdVar1;
    dVar7 = pdVar1[1];
    dVar5 = pdVar1[2];
    dVar9 = (1.0 - dVar8) - dVar5;
    dVar6 = (1.0 - dVar7) - dVar5;
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = dphi->fElem;
    *pdVar3 = (dVar6 * -0.25) / dVar4;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[1] = (dVar9 * -0.25) / dVar4;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar8 = (dVar8 + 1.0) - dVar5;
    pdVar3[2] = (((dVar9 + dVar6) - (dVar9 * dVar6) / dVar4) * -0.25) / dVar4;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = (dVar6 * 0.25) / dVar4;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar5 = (dVar7 + 1.0) - dVar5;
    pdVar3[lVar2 + 1] = (dVar8 * -0.25) / dVar4;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 + 2] = (((dVar8 + dVar6) - (dVar6 * dVar8) / dVar4) * -0.25) / dVar4;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2] = (dVar5 * 0.25) / dVar4;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2 + 1] = (dVar8 * 0.25) / dVar4;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2 + 2] = (((dVar8 + dVar5) - (dVar8 * dVar5) / dVar4) * -0.25) / dVar4;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3] = (dVar5 * -0.25) / dVar4;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3 + 1] = (dVar9 * 0.25) / dVar4;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3 + 2] = (((dVar9 + dVar5) - (dVar9 * dVar5) / dVar4) * -0.25) / dVar4;
  }
  else {
    lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = phi->fElem;
    *pdVar3 = 0.0;
    if ((lVar2 < 2) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[1] = 0.0;
    if ((lVar2 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[2] = 0.0;
    if ((lVar2 < 4) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[3] = 0.0;
    if ((lVar2 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[4] = 1.0;
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = dphi->fElem;
    *pdVar3 = -0.25;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[1] = -0.25;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[2] = -0.25;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = 0.25;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 + 1] = -0.25;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 + 2] = -0.25;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2] = 0.25;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2 + 1] = 0.25;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2 + 2] = -0.25;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3] = -0.25;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3 + 1] = 0.25;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3 + 2] = -0.25;
  }
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2 * 4] = 0.0;
  if ((1 < lVar2) && (4 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    pdVar3[lVar2 * 4 + 1] = 0.0;
    if ((2 < lVar2) && (4 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      pdVar3[lVar2 * 4 + 2] = 1.0;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapePiram::ShapeCorner(const TPZVec<REAL> &pt,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        if(fabs(pt[0])<1.e-10 && fabs(pt[1])<1.e-10 && pt[2]==1.) {
            //para testes com transformaçoes geometricas-->>Que é o que faz o RefPattern!!
            //(0,0,1) nunca é um ponto de integração
            phi(0,0)  = 0.;
            phi(1,0)  = 0.;
            phi(2,0)  = 0.;
            phi(3,0)  = 0.;
            phi(4,0)  = 1.;
            dphi(0,0)  = -0.25;
            dphi(1,0)  = -0.25;
            dphi(2,0)  = -0.25;
            dphi(0,1)  = 0.25;
            dphi(1,1)  = -0.25;
            dphi(2,1)  = -0.25;
            dphi(0,2)  = 0.25;
            dphi(1,2)  = 0.25;
            dphi(2,2)  = -0.25;
            dphi(0,3)  = -0.25;
            dphi(1,3)  = 0.25;
            dphi(2,3)  = -0.25;
            dphi(0,4)  = 0;
            dphi(1,4)  = 0;
            dphi(2,4)  = 1.;
            
            
            
            return;
        }
        
        REAL T0xz = .5*(1.-pt[2]-pt[0]) / (1.-pt[2]);
        REAL T0yz = .5*(1.-pt[2]-pt[1]) / (1.-pt[2]);
        REAL T1xz = .5*(1.-pt[2]+pt[0]) / (1.-pt[2]);
        REAL T1yz = .5*(1.-pt[2]+pt[1]) / (1.-pt[2]);
        REAL lmez = (1.-pt[2]);
        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = pt[2];
        REAL lmexmez = 1.-pt[0]-pt[2];
        REAL lmeymez = 1.-pt[1]-pt[2];
        REAL lmaxmez = 1.+pt[0]-pt[2];
        REAL lmaymez = 1.+pt[1]-pt[2];
        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;
    }